

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

char * stumpless_get_target_default_msgid(stumpless_target *target)

{
  char *msgid_copy;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    lock_target(target);
    target_local = (stumpless_target *)alloc_mem(target->default_msgid_length + 1);
    if (target_local != (stumpless_target *)0x0) {
      memcpy(target_local,target->default_msgid,target->default_msgid_length);
      target_local->default_app_name[target->default_msgid_length - 0x28] = '\0';
      clear_error();
    }
    unlock_target(target);
  }
  return (char *)target_local;
}

Assistant:

const char *
stumpless_get_target_default_msgid( const struct stumpless_target *target ) {
  char *msgid_copy = NULL;

  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );

  msgid_copy = alloc_mem( target->default_msgid_length + 1 );
  if( !msgid_copy ) {
    goto cleanup_and_return;
  }

  memcpy( msgid_copy, target->default_msgid, target->default_msgid_length );
  msgid_copy[target->default_msgid_length] = '\0';
  clear_error(  );

cleanup_and_return:
  unlock_target( target );
  return msgid_copy;
}